

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateGLImpl::
DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
::RESOURCE_DIMENSION_bool_
          (void *this,GLResourceAttribs *Attribs,RESOURCE_DIMENSION ResDim,bool IsMS)

{
  uint uVar1;
  long lVar2;
  ShaderResourceCacheGL *ResourceCache;
  char (*in_R8) [10];
  bool bVar3;
  string msg;
  
  lVar2 = *(long *)((long)this + 0x10);
  uVar1 = *(uint *)(lVar2 + 8);
  if (((ulong)uVar1 != 0xffffffff) &&
     ((*(int *)(lVar2 + 0xc) != -1 || (*(int *)(lVar2 + 0x10) != -1)))) {
    if (uVar1 == 0xffffffff) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
      if (*(int *)(lVar2 + 0xc) == -1) {
        bVar3 = *(int *)(lVar2 + 0x10) != -1;
      }
    }
    if ((!bVar3) || (*(int *)(lVar2 + 0x10) == -1)) {
      ResourceCache = *(ShaderResourceCacheGL **)(*(long *)((long)this + 8) + (ulong)uVar1 * 8);
      if (ResourceCache == (ShaderResourceCacheGL *)0x0) {
        FormatString<char[25],unsigned_int,char[10]>
                  (&msg,(Diligent *)"Resource cache at index ",(char (*) [25])(lVar2 + 8),
                   (uint *)0x357712,in_R8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Validate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x303);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      PipelineResourceSignatureGLImpl::DvpValidateCommittedResource
                ((PipelineResourceSignatureGLImpl *)**(undefined8 **)((long)this + 0x10),Attribs,
                 ResDim,IsMS,*(Uint32 *)((long)*(undefined8 **)((long)this + 0x10) + 0xc),
                 ResourceCache,
                 *(char **)(*(long *)(*this + 0xf8) + (ulong)**(uint **)((long)this + 0x18) * 0x20),
                 *(char **)(*this + 0x18));
    }
  }
  *(long *)((long)this + 0x10) = *(long *)((long)this + 0x10) + 0x18;
  return;
}

Assistant:

void Validate(const ShaderResourcesGL::GLResourceAttribs& Attribs, RESOURCE_DIMENSION ResDim, bool IsMS)
        {
            if (*attrib_it && !attrib_it->IsImmutableSampler())
            {
                const auto* pResourceCache = ResourceCaches[attrib_it->SignatureIndex];
                DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", attrib_it->SignatureIndex, " is null.");
                attrib_it->pSignature->DvpValidateCommittedResource(Attribs, ResDim, IsMS, attrib_it->ResourceIndex, *pResourceCache,
                                                                    PSO.m_ShaderNames[shader_ind].c_str(), PSO.m_Desc.Name);
            }
            ++attrib_it;
        }